

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O0

void __thiscall mdsplit::mdsplitter::remove_auto_toc(mdsplitter *this)

{
  bool bVar1;
  reference pmVar2;
  reference pbVar3;
  ostream *poVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  undefined1 local_a3;
  undefined1 local_a2;
  byte local_a1;
  bool found_toc_end;
  bool found_toc_begin;
  iterator iStack_a0;
  bool in_codeblock;
  iterator toc_line_it_end;
  iterator toc_line_it;
  iterator line_it_end;
  iterator line_it;
  mdsection *section;
  iterator __end1;
  iterator __begin1;
  vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> *__range1;
  undefined1 local_50 [8];
  regex toc_end_regex;
  regex toc_begin_regex;
  mdsplitter *this_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &toc_end_regex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             " *<!-- START doctoc generated TOC please keep comment here to allow auto update --> *"
             ,0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50,
             " *<!-- END doctoc generated TOC please keep comment here to allow auto update --> *",
             0x10);
  __end1 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::begin
                     (&this->sections_);
  section = (mdsection *)
            std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::end
                      (&this->sections_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                                *)&section);
    if (!bVar1) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 &toc_end_regex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    pmVar2 = __gnu_cxx::
             __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
             ::operator*(&__end1);
    line_it_end = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(&pmVar2->lines);
    iStack_a0 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&pmVar2->lines);
    local_a1 = 0;
    toc_line_it_end = iStack_a0;
    toc_line_it = iStack_a0;
    while (bVar1 = __gnu_cxx::operator!=(&line_it_end,&toc_line_it), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&line_it_end);
      bVar1 = is_codeblock(pbVar3);
      if (bVar1) {
        local_a1 = (local_a1 & 1) != 1;
      }
      if ((local_a1 & 1) == 0) {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&line_it_end);
        local_a2 = std::
                   regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                             (pbVar3,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     &toc_end_regex._M_automaton.
                                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,0);
        if ((bool)local_a2) {
          toc_line_it_end = line_it_end;
        }
        else {
          pbVar3 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&line_it_end);
          local_a3 = std::
                     regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                               (pbVar3,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       local_50,0);
          if ((bool)local_a3) {
            iStack_a0 = (iterator)line_it_end._M_current;
            break;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&line_it_end);
    }
    bVar1 = __gnu_cxx::operator!=(&toc_line_it_end,&toc_line_it);
    if ((bVar1) && (bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff60,&toc_line_it), bVar1)) {
      if ((this->trace_ & 1U) != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Found Auto TOC in ");
        poVar4 = std::operator<<(poVar4,(string *)&pmVar2->header_name);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_b0,&toc_line_it_end);
      local_c0 = std::
                 next<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (iStack_a0._M_current,1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_b8,&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&pmVar2->lines,local_b0,local_b8);
    }
    __gnu_cxx::
    __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void mdsplitter::remove_auto_toc() {
        std::regex toc_begin_regex{
            R"( *<!-- START doctoc generated TOC please keep comment here to allow auto update --> *)"};
        std::regex toc_end_regex{
            R"( *<!-- END doctoc generated TOC please keep comment here to allow auto update --> *)"};
        for (auto &section : sections_) {
            auto line_it = section.lines.begin();
            auto line_it_end = section.lines.end();
            auto toc_line_it = line_it_end;
            auto toc_line_it_end = line_it_end;
            bool in_codeblock = false;
            for (; line_it != line_it_end; ++line_it) {
                if (is_codeblock(*line_it)) {
                    in_codeblock = 1 - in_codeblock;
                }
                if (in_codeblock) {
                    continue;
                }
                bool found_toc_begin =
                    std::regex_search(*line_it, toc_begin_regex);
                if (found_toc_begin) {
                    toc_line_it = line_it;
                } else {
                    bool found_toc_end =
                        std::regex_search(*line_it, toc_end_regex);
                    if (found_toc_end) {
                        toc_line_it_end = line_it;
                        break;
                    }
                }
            }
            if (toc_line_it != line_it_end && toc_line_it_end != line_it_end) {
                if (trace_) {
                    std::cout << "Found Auto TOC in " << section.header_name
                              << std::endl;
                }
                section.lines.erase(toc_line_it, std::next(toc_line_it_end));
            }
        }
    }